

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcUtil.c
# Opt level: O3

int Lpk_FunSuppMinimize(Lpk_Fun_t *p)

{
  uint nVarsAll;
  int iVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint nVars;
  
  nVarsAll = *(uint *)&p->field_0x8 >> 7 & 0x1f;
  uVar3 = p->uSupp;
  if ((-1 << (sbyte)nVarsAll ^ uVar3) == 0xffffffff) {
    iVar1 = 0;
  }
  else {
    *(uint *)&p->field_0x8 = *(uint *)&p->field_0x8 & 0xbfffffff;
    uVar4 = (uVar3 >> 1 & 0x55555555) + (uVar3 & 0x55555555);
    uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333);
    uVar4 = (uVar4 >> 4 & 0x7070707) + (uVar4 & 0x7070707);
    uVar4 = (uVar4 >> 8 & 0xf000f) + (uVar4 & 0xf000f);
    nVars = (uVar4 >> 0x10) + (uVar4 & 0xffff);
    uVar4 = 1 << ((sbyte)nVarsAll - 5U & 0x1f);
    if (nVarsAll < 6) {
      uVar4 = 1;
    }
    Kit_TruthShrink((uint *)(p->pFanins + (ulong)uVar4 * 4 + 0x10),(uint *)&p->field_0xe4,nVars,
                    nVarsAll,uVar3,1);
    lVar2 = 0;
    uVar3 = 0;
    do {
      if ((p->uSupp >> ((uint)lVar2 & 0x1f) & 1) != 0) {
        p->pFanins[(int)uVar3] = p->pFanins[lVar2];
        p->pDelays[(int)uVar3] = p->pDelays[lVar2];
        uVar3 = uVar3 + 1;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x10);
    if (uVar3 != nVars) {
      __assert_fail("k == nVarsNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkAbcUtil.c"
                    ,0xa9,"int Lpk_FunSuppMinimize(Lpk_Fun_t *)");
    }
    *(uint *)&p->field_0x8 = *(uint *)&p->field_0x8 & 0xfffff07f | (nVars & 0x1f) << 7;
    p->uSupp = ~(-1 << ((byte)nVars & 0x1f));
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int Lpk_FunSuppMinimize( Lpk_Fun_t * p )
{
    int i, k, nVarsNew;
    // compress the truth table
    if ( p->uSupp == Kit_BitMask(p->nVars) )
        return 0;
    // invalidate support info
    p->fSupports = 0;
//Extra_PrintBinary( stdout, &p->uSupp, p->nVars ); printf( "\n" );
    // minimize support
    nVarsNew = Kit_WordCountOnes(p->uSupp);
    Kit_TruthShrink( Lpk_FunTruth(p, 1), Lpk_FunTruth(p, 0), nVarsNew, p->nVars, p->uSupp, 1 );
    k = 0;
    Lpk_SuppForEachVar( p->uSupp, i )
    {
        p->pFanins[k] = p->pFanins[i];
        p->pDelays[k] = p->pDelays[i];
/*
        if ( p->fSupports )
        {
            p->puSupps[2*k+0] = p->puSupps[2*i+0];
            p->puSupps[2*k+1] = p->puSupps[2*i+1];
        }
*/
        k++;
    }
    assert( k == nVarsNew );
    p->nVars = k;
    p->uSupp = Kit_BitMask(p->nVars);
    return 1;
}